

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Option *opt)

{
  float *pfVar1;
  int *piVar2;
  size_t __size;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  int i;
  int iVar10;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int i_1;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  size_t totalsize;
  ulong uVar21;
  ulong uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int size;
  void *ptr_1;
  void *ptr;
  void *local_1c0;
  void *local_190;
  int local_184;
  int local_180;
  int local_17c;
  undefined1 local_178 [16];
  Allocator *local_160;
  long local_158;
  size_t local_150;
  void *local_148;
  void *local_140;
  long local_138;
  long local_130;
  long local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  long local_108;
  size_t local_100;
  void *local_f8;
  long local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  void *local_c0;
  ulong local_b8;
  void *local_b0;
  int *local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  Allocator *local_90;
  undefined4 local_88;
  uint local_84;
  undefined8 local_80;
  long local_78;
  void *local_70;
  int *local_68;
  undefined8 local_60;
  undefined4 local_58;
  Allocator *local_50;
  undefined4 local_48;
  uint local_44;
  undefined8 local_40;
  long local_38;
  
  uVar18 = (ulong)(uint)bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = top_blob->w;
  lVar9 = (long)(int)uVar4;
  local_50 = opt->workspace_allocator;
  local_60 = 4;
  local_58 = 1;
  local_48 = 1;
  local_40 = 0x100000001;
  if (lVar9 == 0) {
    iVar6 = -100;
  }
  else {
    local_178._8_8_ = local_178._0_8_;
    local_178._0_8_ = weight_xc;
    lVar20 = lVar9 * 4;
    __size = lVar9 * 4 + 4;
    local_17c = reverse;
    local_44 = uVar4;
    local_38 = lVar9;
    if (local_50 == (Allocator *)0x0) {
      local_b0 = (void *)0x0;
      iVar6 = posix_memalign(&local_b0,0x10,__size);
      pvVar7 = (void *)0x0;
      if (iVar6 == 0) {
        pvVar7 = local_b0;
      }
    }
    else {
      pvVar7 = (void *)(**(code **)(*(long *)local_50 + 0x10))(local_50,__size);
    }
    local_68 = (int *)((long)pvVar7 + lVar20);
    *(undefined4 *)((long)pvVar7 + lVar20) = 1;
    local_90 = opt->workspace_allocator;
    local_a0 = 4;
    local_98 = 1;
    local_88 = 1;
    local_80 = 0x100000001;
    local_84 = uVar4;
    local_78 = lVar9;
    local_70 = pvVar7;
    if (local_90 == (Allocator *)0x0) {
      local_190 = (void *)0x0;
      iVar6 = posix_memalign(&local_190,0x10,__size);
      pvVar8 = (void *)0x0;
      if (iVar6 == 0) {
        pvVar8 = local_190;
      }
    }
    else {
      pvVar8 = (void *)(**(code **)(*(long *)local_90 + 0x10))(local_90,__size);
    }
    local_a8 = (int *)(lVar20 + (long)pvVar8);
    *(undefined4 *)((long)pvVar8 + lVar20) = 1;
    local_160 = opt->workspace_allocator;
    lVar20 = lVar9 * 0x10;
    local_b0 = pvVar8;
    if (local_160 == (Allocator *)0x0) {
      local_1c0 = (void *)0x0;
      local_190 = (void *)0x0;
      iVar6 = posix_memalign(&local_190,0x10,lVar20 + 4);
      if (iVar6 == 0) {
        local_1c0 = local_190;
      }
    }
    else {
      local_1c0 = (void *)(**(code **)(*(long *)local_160 + 0x10))(local_160);
    }
    uVar21 = (ulong)uVar4;
    *(undefined4 *)((long)local_1c0 + lVar20) = 1;
    local_158 = lVar20;
    if (0 < (int)uVar4) {
      memset(pvVar7,0,uVar21 * 4);
      memset(pvVar8,0,uVar21 * 4);
    }
    if (0 < (int)uVar3) {
      local_f8 = bottom_blob->data;
      local_100 = bottom_blob->elemsize;
      local_180 = bottom_blob->w;
      pvVar7 = bias_c->data;
      lVar20 = (long)bias_c->w * bias_c->elemsize;
      local_c0 = (void *)(lVar20 * 3 + (long)pvVar7);
      local_108 = *(long *)local_178._0_8_;
      local_110 = weight_hc->data;
      local_c8 = (long)*(int *)(local_178._0_8_ + 0x2c) * *(long *)(local_178._0_8_ + 0x10);
      local_d0 = (long)weight_hc->w * weight_hc->elemsize;
      local_148 = top_blob->data;
      local_150 = top_blob->elemsize;
      local_184 = top_blob->w;
      local_128 = local_c8 * (int)(uVar4 * 3) + local_108;
      local_130 = local_c8 * (int)(uVar4 * 2) + local_108;
      local_138 = local_c8 * lVar9 + local_108;
      local_120 = (void *)((int)(uVar4 * 3) * local_d0 + (long)local_110);
      local_118 = (void *)((int)(uVar4 * 2) * local_d0 + (long)local_110);
      local_140 = (void *)(lVar9 * local_d0 + (long)local_110);
      local_e0 = local_b0;
      local_e8 = local_70;
      local_f0 = uVar21 * 4;
      uVar19 = 0;
      local_b8 = uVar18;
      do {
        uVar5 = ~uVar19 + uVar3;
        if (local_17c == 0) {
          uVar5 = uVar19;
        }
        if (0 < (int)uVar4) {
          uVar22 = 0;
          lVar9 = local_128;
          pvVar8 = local_110;
          pvVar12 = local_140;
          pvVar13 = local_118;
          pvVar14 = local_120;
          lVar15 = local_108;
          lVar16 = local_138;
          lVar17 = local_130;
          do {
            fVar26 = *(float *)((long)local_c0 + uVar22 * 4);
            fVar25 = *(float *)((long)pvVar7 + uVar22 * 4 + lVar20 * 2);
            fVar24 = *(float *)((long)pvVar7 + uVar22 * 4 + lVar20);
            fVar23 = *(float *)((long)pvVar7 + uVar22 * 4);
            if (0 < (int)uVar18) {
              uVar11 = 0;
              do {
                fVar27 = *(float *)((long)local_f8 +
                                   uVar11 * 4 + (long)(int)(local_180 * uVar5) * local_100);
                fVar23 = fVar23 + fVar27 * *(float *)(lVar15 + uVar11 * 4);
                fVar24 = fVar24 + fVar27 * *(float *)(lVar16 + uVar11 * 4);
                fVar25 = fVar25 + fVar27 * *(float *)(lVar17 + uVar11 * 4);
                fVar26 = fVar26 + fVar27 * *(float *)(lVar9 + uVar11 * 4);
                uVar11 = uVar11 + 1;
              } while (uVar18 != uVar11);
            }
            uVar18 = 0;
            do {
              if (uVar19 == 0) {
                fVar27 = 0.0;
              }
              else {
                fVar27 = *(float *)((long)local_70 + uVar18 * 4);
              }
              fVar23 = fVar23 + fVar27 * *(float *)((long)pvVar8 + uVar18 * 4);
              fVar24 = fVar24 + fVar27 * *(float *)((long)pvVar12 + uVar18 * 4);
              fVar25 = fVar25 + fVar27 * *(float *)((long)pvVar13 + uVar18 * 4);
              fVar26 = fVar26 + fVar27 * *(float *)((long)pvVar14 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar21 != uVar18);
            pfVar1 = (float *)((long)local_1c0 + uVar22 * 0x10);
            *pfVar1 = fVar23;
            pfVar1[1] = fVar24;
            pfVar1[2] = fVar25;
            pfVar1[3] = fVar26;
            uVar22 = uVar22 + 1;
            lVar9 = lVar9 + local_c8;
            lVar17 = lVar17 + local_c8;
            lVar16 = lVar16 + local_c8;
            lVar15 = lVar15 + local_c8;
            pvVar14 = (void *)((long)pvVar14 + local_d0);
            pvVar13 = (void *)((long)pvVar13 + local_d0);
            pvVar12 = (void *)((long)pvVar12 + local_d0);
            pvVar8 = (void *)((long)pvVar8 + local_d0);
            uVar18 = local_b8;
          } while (uVar22 != uVar21);
          uVar18 = local_b8;
          if (0 < (int)uVar4) {
            local_d8 = (void *)((long)(int)(uVar5 * local_184) * local_150 + (long)local_148);
            lVar9 = 0;
            do {
              fVar24 = expf(-*(float *)((long)local_1c0 + lVar9 * 4));
              fVar26 = *(float *)((long)local_1c0 + lVar9 * 4 + 8);
              fVar25 = *(float *)((long)local_1c0 + lVar9 * 4 + 0xc);
              if (uVar19 == 0) {
                fVar23 = 0.0;
              }
              else {
                local_178 = ZEXT416((uint)fVar26);
                fVar26 = expf(-*(float *)((long)local_1c0 + lVar9 * 4 + 4));
                fVar23 = 1.0 / (fVar26 + 1.0);
                fVar26 = (float)local_178._0_4_;
              }
              fVar26 = expf(-fVar26);
              local_178._0_4_ = fVar26 + 1.0;
              fVar26 = tanhf(fVar25);
              pvVar8 = local_e0;
              fVar26 = fVar26 / (fVar24 + 1.0) + fVar23 * *(float *)((long)local_e0 + lVar9);
              fVar25 = tanhf(fVar26);
              *(float *)((long)pvVar8 + lVar9) = fVar26;
              *(float *)((long)local_e8 + lVar9) = fVar25 / (float)local_178._0_4_;
              *(float *)((long)local_d8 + lVar9) = fVar25 / (float)local_178._0_4_;
              lVar9 = lVar9 + 4;
            } while (local_f0 != lVar9);
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar3);
    }
    LOCK();
    piVar2 = (int *)((long)local_1c0 + local_158);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_160 == (Allocator *)0x0) {
        if (local_1c0 != (void *)0x0) {
          free(local_1c0);
        }
      }
      else {
        (**(code **)(*(long *)local_160 + 0x18))(local_160,local_1c0);
      }
    }
    if (local_a8 != (int *)0x0) {
      LOCK();
      *local_a8 = *local_a8 + -1;
      UNLOCK();
      if (*local_a8 == 0) {
        if (local_90 == (Allocator *)0x0) {
          if (local_b0 != (void *)0x0) {
            free(local_b0);
          }
        }
        else {
          (**(code **)(*(long *)local_90 + 0x18))();
        }
      }
    }
    iVar10 = 0;
    iVar6 = 0;
    if (local_68 != (int *)0x0) {
      LOCK();
      *local_68 = *local_68 + -1;
      UNLOCK();
      iVar6 = iVar10;
      if (*local_68 == 0) {
        if (local_50 == (Allocator *)0x0) {
          if (local_70 != (void *)0x0) {
            free(local_70);
          }
        }
        else {
          (**(code **)(*(long *)local_50 + 0x18))();
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;

    // internal cell state
    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    hidden.fill(0.f);
    cell.fill(0.f);

    // unroll
    for (int t=0; t<T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c
        int cont = t > 0;

        int ti = reverse ? T-1-t : t;

        const float* x = bottom_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i=0; i<size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i=0; i<num_output; i++)
            {
                float h_cont = cont ? hidden[i] : 0.f;

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = cont ? 1.f / (1.f + exp(-F)) : 0.f;
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell[q] + I * G;
            float H = O * tanh(cell2);
            cell[q] = cell2;
            hidden[q] = H;
            output_data[q] = H;
        }

        // no cell output here
    }

    return 0;
}